

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

uchar * stbtt_GetGlyphSDF(stbtt_fontinfo *info,float scale,int glyph,int padding,uchar onedge_value,
                         float pixel_dist_scale,int *width,int *height,int *xoff,int *yoff)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  undefined8 *puVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  byte bVar13;
  byte bVar14;
  stbtt_fontinfo *psVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  undefined7 in_register_00000009;
  stbtt_vertex *psVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  short sVar26;
  ushort uVar27;
  ushort uVar28;
  int iVar29;
  ulong uVar30;
  uchar *puVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float in_XMM0_Db;
  double dVar36;
  float extraout_XMM0_Db_00;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar39 [16];
  undefined8 extraout_XMM0_Qb_01;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar44;
  undefined8 uVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  uint uVar52;
  uint uVar53;
  float fVar54;
  undefined1 auVar51 [16];
  float in_XMM4_Da;
  float fVar55;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  int iy1;
  int iy0;
  int ix1;
  int ix0;
  stbtt_vertex *verts;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  float local_1c8;
  float local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  int local_1a0;
  int local_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  long local_170;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  uint uStack_140;
  uint uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  uchar *local_120;
  ulong local_118;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  stbtt_fontinfo *local_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  uint uStack_70;
  uint uStack_6c;
  stbtt_vertex *local_68;
  double local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  stbtt_vertex *local_38;
  undefined8 extraout_XMM0_Qb_00;
  
  if ((scale != 0.0) || (NAN(scale))) {
    local_198 = (float)CONCAT71(in_register_00000009,onedge_value);
    local_1c4 = pixel_dist_scale;
    local_90 = info;
    local_78 = scale;
    fStack_74 = in_XMM0_Db;
    uStack_70 = in_XMM0_Dc;
    uStack_6c = in_XMM0_Dd;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,scale,scale,0.0,0.0,&local_1bc,&local_1cc,&local_1c0,&local_1d0);
    psVar15 = local_90;
    if ((local_1bc != local_1c0) && (local_1cc != local_1d0)) {
      local_1bc = local_1bc - padding;
      local_1cc = local_1cc - padding;
      local_1c0 = local_1c0 + padding;
      local_1d0 = local_1d0 + padding;
      iVar29 = local_1c0 - local_1bc;
      if (width != (int *)0x0) {
        *width = iVar29;
      }
      iVar22 = local_1d0 - local_1cc;
      if (height != (int *)0x0) {
        *height = iVar22;
      }
      if (xoff != (int *)0x0) {
        *xoff = local_1bc;
      }
      if (yoff != (int *)0x0) {
        *yoff = local_1cc;
      }
      local_148 = -local_78;
      fStack_144 = -fStack_74;
      uStack_140 = uStack_70 ^ 0x80000000;
      uStack_13c = uStack_6c ^ 0x80000000;
      uVar16 = stbtt_GetGlyphShape(local_90,glyph,&local_38);
      puVar8 = (undefined8 *)psVar15->userdata;
      local_120 = (uchar *)(*(code *)puVar8[1])(*puVar8,0,(long)(iVar22 * iVar29));
      puVar8 = (undefined8 *)psVar15->userdata;
      local_118 = (ulong)uVar16;
      local_170 = (*(code *)puVar8[1])(*puVar8,0,(long)(int)uVar16 * 4);
      uVar30 = (ulong)uVar16;
      if (0 < (int)uVar16) {
        uVar21 = (ulong)((int)local_118 - 1);
        uVar24 = 0;
        psVar19 = local_38;
        do {
          iVar22 = (int)uVar21;
          if (psVar19->type == '\x03') {
            fVar48 = (float)(int)psVar19->cx * local_78;
            fVar55 = (float)(int)psVar19->cy * local_148;
            fVar48 = ((float)(int)psVar19->x * local_78 - (fVar48 + fVar48)) +
                     (float)(int)local_38[iVar22].x * local_78;
            fVar55 = ((float)(int)psVar19->y * local_148 - (fVar55 + fVar55)) -
                     (float)(int)local_38[iVar22].y * local_78;
            fVar48 = fVar48 * fVar48 + fVar55 * fVar55;
            in_XMM4_Da = 0.0;
            if ((fVar48 != 0.0) || (NAN(fVar48))) {
              in_XMM4_Da = 1.0 / fVar48;
            }
          }
          else {
            in_XMM4_Da = 0.0;
            if (psVar19->type == '\x02') {
              fVar48 = (float)(int)local_38[iVar22].x * local_78 -
                       (float)(int)((long)((ulong)(ushort)psVar19->x << 0x30) >> 0x30) * local_78;
              fVar55 = (float)(int)psVar19->y * local_78 -
                       (float)(int)((long)((ulong)(ushort)local_38[iVar22].y << 0x30) >> 0x30) *
                       local_78;
              fVar48 = SQRT(fVar48 * fVar48 + fVar55 * fVar55);
              in_XMM4_Da = (float)(~-(uint)(fVar48 == 0.0) & (uint)(1.0 / fVar48));
            }
          }
          in_XMM4_Db = 0.0;
          in_XMM4_Dc = 0.0;
          in_XMM4_Dd = 0.0;
          *(float *)(local_170 + uVar24 * 4) = in_XMM4_Da;
          uVar21 = uVar24 & 0xffffffff;
          uVar24 = uVar24 + 1;
          psVar19 = psVar19 + 1;
        } while (uVar30 != uVar24);
      }
      local_1d4 = local_1cc;
      puVar31 = local_120;
      if (local_1cc < local_1d0) {
        local_100 = (float)((uint)local_198 & 0xff);
        local_68 = local_38 + -1;
        local_a8 = local_78;
        fStack_a4 = local_148;
        fStack_a0 = fStack_74;
        fStack_9c = fStack_144;
        fVar48 = local_148;
        fVar55 = fStack_74;
        fVar54 = fStack_144;
        fVar60 = local_148;
        iVar22 = local_1d0;
        local_1a0 = iVar29;
        iVar17 = local_1c0;
        do {
          if (local_1bc < iVar17) {
            fVar59 = (float)local_1d4 + 0.5;
            local_104 = fVar59 / fVar60;
            local_60 = (double)local_104;
            local_108 = local_104 + -0.01;
            local_fc = local_104 + 0.01;
            iVar18 = local_1bc;
            do {
              fVar34 = (float)iVar18 + 0.5;
              dVar36 = fmod(local_60,1.0);
              fVar60 = local_fc;
              if ((0.01 <= (float)dVar36) && (fVar60 = local_104, 0.99 < (float)dVar36)) {
                fVar60 = local_108;
              }
              if ((int)local_118 < 1) {
                fVar61 = -999999.0;
                fVar60 = local_148;
              }
              else {
                fVar61 = fVar34 / local_78;
                local_f8 = fVar60 * 0.0 + fVar61;
                fVar56 = fVar61 * 0.0 - fVar60;
                lVar23 = 0;
                iVar22 = 0;
                fVar35 = local_a8;
                fVar42 = fStack_a4;
                fVar62 = fStack_a0;
                fVar63 = fStack_9c;
                local_19c = iVar18;
                do {
                  if ((&local_38->type)[lVar23] == '\x03') {
                    sVar1 = *(short *)((long)&local_38[-1].x + lVar23);
                    uVar16 = (uint)sVar1;
                    sVar2 = *(short *)((long)&local_38->cx + lVar23);
                    uVar3 = *(ushort *)((long)&local_38->cy + lVar23);
                    sVar4 = *(short *)((long)&local_38->x + lVar23);
                    uVar52 = (uint)sVar4;
                    sVar26 = sVar2;
                    if (sVar4 <= sVar2) {
                      sVar26 = sVar4;
                    }
                    uVar5 = *(ushort *)((long)&local_38->y + lVar23);
                    iVar29 = (int)(short)uVar5;
                    if (sVar1 <= sVar26) {
                      sVar26 = sVar1;
                    }
                    uVar28 = uVar5;
                    if ((short)uVar3 < (short)uVar5) {
                      uVar28 = uVar3;
                    }
                    uVar6 = *(ushort *)((long)local_38 + lVar23 + -0xc);
                    iVar17 = (int)(short)uVar6;
                    uVar27 = uVar3;
                    if ((short)uVar3 <= (short)uVar5) {
                      uVar27 = uVar5;
                    }
                    if ((short)uVar6 < (short)uVar28) {
                      uVar28 = uVar6;
                    }
                    if ((short)uVar27 < (short)uVar6) {
                      uVar27 = uVar6;
                    }
                    if (((fVar60 <= (float)(int)(short)uVar28) ||
                        ((float)(int)(short)uVar27 <= fVar60)) || (fVar61 <= (float)(int)sVar26))
                    goto LAB_001132b4;
                    fVar64 = (float)(int)sVar4;
                    fVar40 = (float)(int)((long)((ulong)uVar16 << 0x30) >> 0x30);
                    fVar50 = (float)(int)(short)uVar5;
                    fVar57 = (float)(int)((long)((ulong)uVar6 << 0x30) >> 0x30);
                    fVar58 = (float)(int)sVar2;
                    fVar49 = (float)(int)(short)uVar3;
                    if ((fVar40 != fVar58) || (NAN(fVar40) || NAN(fVar58))) {
LAB_00112eca:
                      if ((((fVar64 != fVar58) || (NAN(fVar64) || NAN(fVar58))) ||
                          (fVar50 != fVar49)) || (NAN(fVar50) || NAN(fVar49))) {
                        fVar44 = (float)((uint)-fVar40 & 0x80000000);
                        fVar45 = (float)((uint)-fVar40 & 0x80000000);
                        fVar46 = (float)((uint)-fVar40 & 0x80000000);
                        fVar41 = (float)((uint)-fVar40 & 0x80000000) + fVar57;
                        local_c8 = CONCAT44(fVar40,fVar64);
                        local_188 = ZEXT416((uint)fVar49);
                        fVar49 = (float)((uint)-fVar58 & 0x80000000) + fVar49;
                        uStack_c0 = 0;
                        fVar40 = (fVar41 - (fVar49 + fVar49)) +
                                 (float)((uint)-fVar64 & 0x80000000) + fVar50;
                        fVar49 = fVar49 - fVar41;
                        if ((fVar40 != 0.0) || (NAN(fVar40))) {
                          fVar64 = fVar49 * fVar49 - (fVar41 + fVar56) * fVar40;
                          if (0.0 < fVar64) {
                            local_1b8 = (double)CONCAT44(fVar48,fVar58);
                            fStack_b0 = 0.0;
                            fStack_ac = 0.0;
                            local_88._4_4_ = in_XMM4_Db;
                            local_88._0_4_ = in_XMM4_Da;
                            fStack_80 = in_XMM4_Dc;
                            fStack_7c = in_XMM4_Dd;
                            local_b8 = fVar50;
                            fStack_b4 = fVar57;
                            if (fVar64 < 0.0) {
                              local_1c8 = fVar60;
                              fStack_1b0 = fVar55;
                              fStack_1ac = fVar54;
                              local_158 = fVar56;
                              local_10c = fVar61;
                              local_58 = fVar40;
                              fStack_54 = fVar44;
                              fStack_50 = fVar45;
                              fStack_4c = fVar46;
                              local_48 = fVar49;
                              uStack_44 = (uint)-fVar48 & 0x80000000;
                              uStack_40 = (uint)-fVar55 & 0x80000000;
                              uStack_3c = (uint)-fVar54 & 0x80000000;
                              fVar64 = sqrtf(fVar64);
                              fVar49 = local_48;
                              fVar60 = local_1c8;
                              fVar61 = local_10c;
                              fVar35 = local_a8;
                              fVar42 = fStack_a4;
                              fVar62 = fStack_a0;
                              fVar63 = fStack_9c;
                              fVar40 = local_58;
                              fVar44 = fStack_54;
                              fVar45 = fStack_50;
                              fVar46 = fStack_4c;
                              fVar56 = local_158;
                            }
                            else {
                              fVar64 = SQRT(fVar64);
                              fStack_1b0 = fVar55;
                              fStack_1ac = fVar54;
                            }
                            fVar54 = 0.0;
                            fVar55 = 0.0;
                            fVar48 = 0.0;
                            fVar41 = (fVar49 + fVar64) * (-1.0 / fVar40);
                            fVar47 = (fVar49 - fVar64) * (-1.0 / fVar40);
                            bVar9 = fVar41 <= 1.0;
                            bVar10 = 0.0 <= fVar41;
                            bVar12 = bVar10 && bVar9;
                            fVar50 = local_b8;
                            fVar57 = fStack_b4;
                            if (((fVar64 <= 0.0) || (fVar47 < 0.0)) || (1.0 < fVar47)) {
                              bVar12 = false;
                              in_XMM4_Da = (float)local_88._0_4_;
                              in_XMM4_Db = (float)local_88._4_4_;
                              in_XMM4_Dc = fStack_80;
                              in_XMM4_Dd = fStack_7c;
                              if (!bVar10 || !bVar9) goto LAB_0011324a;
                            }
                            else if (!bVar10 || !bVar9) {
                              fVar41 = fVar47;
                            }
                            goto LAB_00113172;
                          }
                          bVar9 = false;
                          bVar12 = false;
                        }
                        else {
                          fVar41 = (fVar41 + fVar56) / (fVar49 * -2.0);
                          bVar12 = false;
                          fVar47 = 0.0;
                          if ((fVar41 < 0.0) ||
                             (local_1b8 = (double)CONCAT44(fVar48,fVar58), fStack_1b0 = fVar55,
                             fStack_1ac = fVar54, 1.0 < fVar41)) {
LAB_0011324a:
                            bVar9 = false;
                            bVar12 = false;
                          }
                          else {
LAB_00113172:
                            in_XMM4_Dd = fVar46;
                            in_XMM4_Dc = fVar45;
                            in_XMM4_Db = fVar44;
                            fVar48 = (float)(local_188._4_4_ & 0x80000000);
                            fVar55 = (float)(local_188._8_4_ & 0x80000000);
                            fVar54 = (float)(local_188._12_4_ & 0x80000000);
                            fVar57 = (float)((uint)fVar57 & 0x80000000) + local_c8._4_4_;
                            fVar58 = ((float)(local_188._0_4_ & 0x80000000) + (float)local_1b8) -
                                     fVar57;
                            fVar50 = ((float)((uint)fVar50 & 0x80000000) + (float)local_c8) - fVar57
                            ;
                            local_198 = fVar41 * fVar41 * fVar50 +
                                        (2.0 - (fVar41 + fVar41)) * fVar41 * fVar58 +
                                        (fVar57 - local_f8);
                            in_XMM4_Da = fVar40 * fVar41 + fVar49;
                            if (bVar12) {
                              local_d8 = fVar47 * fVar47 * fVar50 +
                                         (2.0 - (fVar47 + fVar47)) * fVar47 * fVar58 +
                                         (fVar57 - local_f8);
                              local_e8 = fVar40 * fVar47 + fVar49;
                            }
                            bVar9 = true;
                            local_158 = fVar56;
                          }
                        }
                        iVar29 = ((0.0 <= in_XMM4_Da) - 1) + (uint)(0.0 <= in_XMM4_Da);
                        if (0.0 <= local_198) {
                          iVar29 = 0;
                        }
                        if (!bVar9) {
                          iVar29 = 0;
                        }
                        iVar17 = ((0.0 <= local_e8) - 1) + (uint)(0.0 <= local_e8);
                        if (0.0 <= local_d8) {
                          iVar17 = 0;
                        }
                        if (!bVar12) {
                          iVar17 = 0;
                        }
                        iVar22 = iVar17 + iVar29 + iVar22;
                        goto LAB_001132b4;
                      }
                    }
                    else if ((fVar57 != fVar49) || (NAN(fVar57) || NAN(fVar49))) goto LAB_00112eca;
                    iVar18 = iVar29;
                    if ((short)uVar6 < (short)uVar5) {
                      iVar18 = iVar17;
                    }
                    if ((float)iVar18 < fVar60) {
                      iVar18 = iVar29;
                      if ((short)uVar5 < (short)uVar6) {
                        iVar18 = iVar17;
                      }
                      if (fVar60 < (float)iVar18) {
                        uVar53 = uVar52;
                        if ((int)uVar16 < (int)uVar52) {
                          uVar53 = uVar16;
                        }
                        if ((float)(int)uVar53 < fVar61) {
                          bVar9 = (short)uVar6 < (short)uVar5;
                          fVar40 = (float)(int)(uVar52 - uVar16) *
                                   ((fVar60 - fVar57) / (float)(iVar29 - iVar17)) + fVar40;
                          goto LAB_00112f66;
                        }
                      }
                    }
                  }
                  else if ((&local_38->type)[lVar23] == '\x02') {
                    sVar1 = *(short *)((long)local_38 + lVar23 + -0xc);
                    iVar17 = (int)sVar1;
                    sVar2 = *(short *)((long)&local_38->y + lVar23);
                    iVar18 = (int)sVar2;
                    iVar29 = iVar18;
                    if (sVar1 < sVar2) {
                      iVar29 = iVar17;
                    }
                    if ((float)iVar29 < fVar60) {
                      iVar29 = iVar18;
                      if (sVar2 < sVar1) {
                        iVar29 = iVar17;
                      }
                      if (fVar60 < (float)iVar29) {
                        iVar20 = (int)*(short *)((long)&local_38[-1].x + lVar23);
                        iVar25 = (int)*(short *)((long)&local_38->x + lVar23);
                        iVar29 = iVar25;
                        if (iVar20 < iVar25) {
                          iVar29 = iVar20;
                        }
                        if (fVar61 <= (float)iVar29) goto LAB_001132b4;
                        bVar9 = sVar1 < sVar2;
                        fVar40 = (float)iVar20 +
                                 (float)(iVar25 - iVar20) *
                                 ((fVar60 - (float)iVar17) / (float)(iVar18 - iVar17));
LAB_00112f66:
                        iVar29 = (uint)bVar9 * 2 + -1;
                        if (fVar61 <= fVar40) {
                          iVar29 = 0;
                        }
                        iVar22 = iVar22 + iVar29;
                      }
                    }
                  }
LAB_001132b4:
                  lVar23 = lVar23 + 0xe;
                } while (uVar30 * 0xe != lVar23);
                fVar60 = local_148;
                if ((int)local_118 < 1) {
                  fVar61 = 999999.0;
                }
                else {
                  uVar24 = 0;
                  fVar61 = 999999.0;
                  uVar16 = 0;
                  uVar52 = 0;
                  uVar53 = 0;
                  psVar19 = local_68;
                  do {
                    uVar32._0_2_ = psVar19[1].x;
                    uVar32._2_2_ = psVar19[1].y;
                    auVar37 = pshuflw(ZEXT416(uVar32),ZEXT416(uVar32),0x60);
                    local_198 = (float)(auVar37._0_4_ >> 0x10) * fVar35;
                    fStack_194 = (float)(auVar37._4_4_ >> 0x10) * fVar42;
                    fStack_190 = (float)(auVar37._8_4_ >> 0x10) * fVar62;
                    fStack_18c = (float)(auVar37._12_4_ >> 0x10) * fVar63;
                    fVar56 = local_198 - fVar34;
                    fVar40 = fStack_194 - fVar59;
                    fVar49 = fVar56 * fVar56 + fVar40 * fVar40;
                    uVar32 = -(uint)(fVar49 < fVar61 * fVar61);
                    in_XMM4_Da = (float)((uint)SQRT(fVar49) & uVar32);
                    uVar16 = ~(uint)fStack_194 & uVar16;
                    uVar52 = ~(uint)fStack_190 & uVar52;
                    uVar53 = ~(uint)fStack_18c & uVar53;
                    fVar61 = (float)(~uVar32 & (uint)fVar61 | (uint)in_XMM4_Da);
                    if (psVar19[1].type == '\x03') {
                      local_188._4_4_ = uVar16;
                      local_188._0_4_ = fVar61;
                      local_188._8_4_ = uVar52;
                      local_188._12_4_ = uVar53;
                      uVar33._0_2_ = psVar19->x;
                      uVar33._2_2_ = psVar19->y;
                      auVar38 = pshuflw(ZEXT416(uVar33),ZEXT416(uVar33),0x60);
                      fVar57 = (float)(auVar38._0_4_ >> 0x10) * fVar35;
                      local_e8 = (float)(auVar38._4_4_ >> 0x10) * fVar42;
                      uVar7._0_2_ = psVar19[1].cx;
                      uVar7._2_2_ = psVar19[1].cy;
                      auVar37 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),0x60);
                      local_d8 = (float)(auVar37._0_4_ >> 0x10) * fVar35;
                      fStack_d4 = (float)(auVar37._4_4_ >> 0x10) * fVar42;
                      fStack_d0 = (float)(auVar37._8_4_ >> 0x10) * fVar62;
                      fStack_cc = (float)(auVar37._12_4_ >> 0x10) * fVar63;
                      uVar32 = -(uint)(local_198 < local_d8);
                      uVar33 = -(uint)(fStack_194 < fStack_d4);
                      fVar50 = (float)(~uVar33 & (uint)fStack_194 | (uint)fStack_d4 & uVar33);
                      fVar58 = (float)(~uVar32 & (uint)local_198 | (uint)local_d8 & uVar32);
                      in_XMM4_Dc = (float)(~uVar33 & (uint)fStack_d4 | (uint)fStack_194 & uVar33);
                      in_XMM4_Db = (float)(~uVar32 & (uint)local_d8 | (uint)local_198 & uVar32);
                      auVar37._4_4_ = -(uint)(fVar58 < fVar57);
                      auVar37._0_4_ = -(uint)(fVar50 < local_e8);
                      auVar37._8_4_ = -(uint)(in_XMM4_Dc < local_e8);
                      auVar37._12_4_ = -(uint)(in_XMM4_Db < fVar57);
                      uVar32 = movmskps(3,auVar37);
                      fVar49 = in_XMM4_Db;
                      if ((uVar32 & 8) == 0) {
                        fVar49 = fVar57;
                      }
                      if ((uVar32 & 4) == 0) {
                        in_XMM4_Dc = local_e8;
                        in_XMM4_Db = local_e8;
                      }
                      local_c8 = CONCAT44(local_e8,fVar57);
                      uStack_c0 = CONCAT44((float)(auVar38._12_4_ >> 0x10) * fVar63,
                                           (float)(auVar38._8_4_ >> 0x10) * fVar62);
                      fVar64 = fVar57;
                      if ((uVar32 & 2) == 0) {
                        fVar64 = fVar58;
                      }
                      fVar58 = local_e8;
                      if ((uVar32 & 1) == 0) {
                        fVar58 = fVar50;
                      }
                      in_XMM4_Da = in_XMM4_Dc;
                      in_XMM4_Dd = in_XMM4_Db;
                      local_f8 = fStack_194;
                      fStack_f4 = fStack_194;
                      fStack_f0 = fStack_194;
                      fStack_ec = fStack_194;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      if (((fVar49 - fVar61 < fVar34) && (fVar34 < fVar64 + fVar61)) &&
                         ((in_XMM4_Da = in_XMM4_Dc - fVar61, in_XMM4_Da < fVar59 &&
                          (fVar59 < fVar58 + fVar61)))) {
                        fVar50 = local_d8 - local_198;
                        fVar48 = fStack_d4 - fStack_194;
                        fVar55 = fStack_d0 - fStack_190;
                        fVar54 = fStack_cc - fStack_18c;
                        in_XMM4_Da = fStack_d4 - fStack_194;
                        fVar57 = (local_198 - (local_d8 + local_d8)) + fVar57;
                        fVar58 = (fStack_194 - (fStack_d4 + fStack_d4)) + local_e8;
                        fVar49 = *(float *)(local_170 + uVar24 * 4);
                        fVar64 = (fVar50 * fVar57 + in_XMM4_Da * fVar58) * 3.0;
                        local_158 = fStack_d4;
                        fStack_154 = fStack_d4;
                        fStack_150 = fStack_d4;
                        fStack_14c = fStack_d4;
                        if ((fVar49 != 0.0) || (NAN(fVar49))) {
                          fVar64 = fVar64 * fVar49;
                          fVar60 = fVar50 * fVar50 + in_XMM4_Da * in_XMM4_Da;
                          fVar60 = (fVar60 + fVar60 + fVar57 * fVar56 + fVar58 * fVar40) * fVar49;
                          local_b8 = fVar64 / -3.0;
                          fVar35 = (fVar64 * fVar64) / -3.0 + fVar60;
                          fStack_1b0 = fVar64 * ((fVar64 + fVar64) * fVar64 + fVar60 * -9.0);
                          fVar61 = fStack_1b0 / 27.0 +
                                   fVar49 * (fVar56 * fVar50 + in_XMM4_Da * fVar40);
                          fVar60 = fVar35 * fVar35 * fVar35;
                          fVar42 = fVar61 * fVar61 + (fVar60 * 4.0) / 27.0;
                          local_1b8 = (double)CONCAT44(fStack_1b0,fVar61);
                          fStack_1ac = fStack_1b0;
                          fStack_b4 = fVar48;
                          fStack_b0 = fVar55;
                          fStack_ac = fVar54;
                          if (fVar42 < 0.0) {
                            fVar35 = fVar35 / -3.0;
                            if (fVar35 < 0.0) {
                              local_168._4_4_ = fVar48;
                              local_168._0_4_ = fVar60;
                              fStack_160 = fVar55;
                              fStack_15c = fVar54;
                              local_138 = sqrtf(fVar35);
                              fVar60 = (float)local_168._0_4_;
                              fStack_134 = extraout_XMM0_Db;
                              fStack_130 = extraout_XMM0_Dc;
                              fStack_12c = extraout_XMM0_Dd;
                            }
                            else {
                              local_138 = SQRT(fVar35);
                              fStack_134 = fVar48;
                              fStack_130 = fVar55;
                              fStack_12c = fVar54;
                            }
                            dVar36 = (double)(-27.0 / fVar60);
                            if (dVar36 < 0.0) {
                              dVar36 = sqrt(dVar36);
                            }
                            else {
                              dVar36 = SQRT(dVar36);
                            }
                            dVar36 = acos((double)(float)local_1b8 * dVar36 * -0.5);
                            local_1b8 = (double)((float)dVar36 / 3.0);
                            auVar39._0_8_ = cos(local_1b8);
                            auVar39._8_8_ = extraout_XMM0_Qb_00;
                            register0x00001204 = auVar39._4_12_;
                            local_168._0_4_ = (undefined4)auVar39._0_8_;
                            dVar36 = cos(local_1b8 + -1.570796);
                            uVar43 = CONCAT44(local_b8 +
                                              -local_138 *
                                              ((float)dVar36 * 1.7320508 + (float)local_168._0_4_),
                                              local_b8 +
                                              (float)local_168._0_4_ * (local_138 + local_138));
                            local_138 = local_b8 -
                                        ((float)local_168._0_4_ - (float)dVar36 * 1.7320508) *
                                        local_138;
                            bVar13 = 1;
                            bVar14 = 1;
                            fStack_134 = fStack_b4;
                            fStack_130 = fStack_b0;
                            fStack_12c = fStack_ac;
                          }
                          else {
                            if (fVar42 < 0.0) {
                              local_1c8 = sqrtf(fVar42);
                              fVar61 = (float)local_1b8;
                            }
                            else {
                              local_1c8 = SQRT(fVar42);
                            }
                            fVar60 = (local_1c8 - fVar61) * 0.5;
                            if (0.0 <= fVar60) {
                              auVar38._0_8_ = pow((double)fVar60,0.3333333432674408);
                              auVar38._8_8_ = extraout_XMM0_Qb_01;
                              register0x00001204 = auVar38._4_12_;
                              local_88._0_4_ = (undefined4)auVar38._0_8_;
                            }
                            else {
                              dVar36 = pow((double)-fVar60,0.3333333432674408);
                              local_88 = (undefined1  [8])
                                         (CONCAT44((int)((ulong)dVar36 >> 0x20),(float)dVar36) ^
                                         0x8000000080000000);
                              fStack_80 = (float)((uint)extraout_XMM0_Qb ^ 0x80000000);
                              fStack_7c = (float)((uint)((ulong)extraout_XMM0_Qb >> 0x20) ^
                                                 0x80000000);
                            }
                            fVar60 = (-(float)local_1b8 - local_1c8) * 0.5;
                            if (0.0 <= fVar60) {
                              dVar36 = pow((double)fVar60,0.3333333432674408);
                              fVar60 = (float)dVar36;
                            }
                            else {
                              dVar36 = pow((double)-fVar60,0.3333333432674408);
                              fVar60 = -(float)dVar36;
                            }
                            uVar43 = CONCAT44(local_168._0_4_,
                                              local_b8 + (float)local_88._0_4_ + fVar60);
                            bVar13 = 0;
                            bVar14 = 0;
                          }
                          fVar60 = local_148;
                          fVar35 = local_a8;
                          fVar42 = fStack_a4;
                          fVar62 = fStack_a0;
                          fVar63 = fStack_9c;
                          fVar61 = (float)local_188._0_4_;
                          uVar16 = local_188._4_4_;
                          uVar52 = local_188._8_4_;
                          uVar53 = local_188._12_4_;
LAB_00113a7e:
                          fVar56 = (float)uVar43;
                          local_168._4_4_ = (undefined4)((ulong)uVar43 >> 0x20);
                          if ((0.0 <= fVar56) && (fVar56 <= 1.0)) {
                            fVar40 = 1.0 - fVar56;
                            fVar49 = (fVar56 + fVar56) * fVar40;
                            fVar61 = (fVar56 * fVar56 * (float)local_c8 +
                                     fVar40 * fVar40 * local_198 + local_d8 * fVar49) - fVar34;
                            fVar56 = (fVar56 * fVar56 * local_e8 +
                                     fVar40 * fVar40 * local_f8 + fVar49 * local_158) - fVar59;
                            fVar56 = fVar61 * fVar61 + fVar56 * fVar56;
                            fVar61 = (float)local_188._0_4_;
                            uVar16 = local_188._4_4_;
                            uVar52 = local_188._8_4_;
                            uVar53 = local_188._12_4_;
                            if (fVar56 < (float)local_188._0_4_ * (float)local_188._0_4_) {
                              fVar61 = SQRT(fVar56);
                              uVar16 = 0;
                              uVar52 = 0;
                              uVar53 = 0;
                            }
                          }
                          local_168._0_4_ = local_168._4_4_;
                          fStack_160 = (float)local_168._4_4_;
                          fStack_15c = (float)local_168._4_4_;
                          if ((bool)(bVar13 & ((float)local_168._4_4_ <= 1.0 &&
                                              0.0 <= (float)local_168._4_4_))) {
                            fVar40 = 1.0 - (float)local_168._4_4_;
                            fVar49 = ((float)local_168._4_4_ + (float)local_168._4_4_) * fVar40;
                            fVar56 = ((float)local_168._4_4_ * (float)local_168._4_4_ *
                                      (float)local_c8 +
                                     fVar40 * fVar40 * local_198 + local_d8 * fVar49) - fVar34;
                            fVar40 = ((float)local_168._4_4_ * (float)local_168._4_4_ * local_e8 +
                                     fVar40 * fVar40 * local_f8 + fVar49 * local_158) - fVar59;
                            fVar56 = fVar56 * fVar56 + fVar40 * fVar40;
                            if (fVar56 < fVar61 * fVar61) {
                              fVar61 = SQRT(fVar56);
                              uVar16 = 0;
                              uVar52 = 0;
                              uVar53 = 0;
                            }
                          }
                          in_XMM4_Da = local_138;
                          in_XMM4_Db = fStack_134;
                          in_XMM4_Dc = fStack_130;
                          in_XMM4_Dd = fStack_12c;
                          if ((bool)(bVar14 & (0.0 <= local_138 && local_138 <= 1.0))) {
                            fVar40 = 1.0 - local_138;
                            fVar49 = (local_138 + local_138) * fVar40;
                            fVar56 = (local_138 * local_138 * (float)local_c8 +
                                     fVar40 * fVar40 * local_198 + local_d8 * fVar49) - fVar34;
                            in_XMM4_Da = (local_138 * local_138 * local_e8 +
                                         fVar40 * fVar40 * local_f8 + local_158 * fVar49) - fVar59;
                            in_XMM4_Da = in_XMM4_Da * in_XMM4_Da;
                            fVar56 = fVar56 * fVar56 + in_XMM4_Da;
                            if (fVar56 < fVar61 * fVar61) {
                              fVar61 = SQRT(fVar56);
                              uVar16 = 0;
                              uVar52 = 0;
                              uVar53 = 0;
                            }
                          }
                        }
                        else {
                          fVar49 = fVar50 * fVar50 + in_XMM4_Da * in_XMM4_Da;
                          fVar49 = fVar49 + fVar49 + fVar57 * fVar56 + fVar58 * fVar40;
                          in_XMM4_Da = in_XMM4_Da * fVar40;
                          fVar56 = fVar50 * fVar56 + in_XMM4_Da;
                          in_XMM4_Db = fStack_d4;
                          in_XMM4_Dc = fStack_d4;
                          in_XMM4_Dd = fStack_d4;
                          if ((fVar64 != 0.0) || (NAN(fVar64))) {
                            fVar56 = fVar49 * fVar49 + fVar56 * fVar64 * -4.0;
                            if (0.0 <= fVar56) {
                              if (fVar56 < 0.0) {
                                local_168._4_4_ = fVar48;
                                local_168._0_4_ = fVar64;
                                fStack_160 = fVar55;
                                fStack_15c = fVar54;
                                local_1b8 = (double)CONCAT44(fVar48,fVar49);
                                fStack_1b0 = fVar55;
                                fStack_1ac = fVar54;
                                fVar56 = sqrtf(fVar56);
                                fVar49 = (float)local_1b8;
                                fVar48 = local_1b8._4_4_;
                                fVar55 = fStack_1b0;
                                fVar54 = fStack_1ac;
                                fVar60 = local_148;
                                fVar35 = local_a8;
                                fVar42 = fStack_a4;
                                fVar62 = fStack_a0;
                                fVar63 = fStack_9c;
                                fVar61 = (float)local_188._0_4_;
                                uVar16 = local_188._4_4_;
                                uVar52 = local_188._8_4_;
                                uVar53 = local_188._12_4_;
                                fVar40 = extraout_XMM0_Db_00;
                              }
                              else {
                                fVar56 = SQRT(fVar56);
                                local_168._0_4_ = fVar64;
                                fVar40 = fVar48;
                              }
                              local_168._0_4_ = (float)local_168._0_4_ + (float)local_168._0_4_;
                              auVar51._0_4_ = -fVar49 - fVar56;
                              auVar51._4_4_ = fVar56 - fVar49;
                              auVar51._8_4_ = -fVar48 - fVar40;
                              auVar51._12_4_ = fVar40 - fVar48;
                              auVar11._4_4_ = local_168._0_4_;
                              auVar11._0_4_ = local_168._0_4_;
                              auVar11._8_4_ = local_168._0_4_;
                              auVar11._12_4_ = local_168._0_4_;
                              auVar37 = divps(auVar51,auVar11);
                              uVar43 = auVar37._0_8_;
                              bVar13 = 1;
                              goto LAB_00113a74;
                            }
                          }
                          else if ((fVar49 != 0.0) || (NAN(fVar49))) {
                            uVar43 = CONCAT44(local_168._0_4_,-fVar56 / fVar49);
                            bVar13 = 0;
LAB_00113a74:
                            bVar14 = 0;
                            goto LAB_00113a7e;
                          }
                        }
                      }
                    }
                    else {
                      in_XMM4_Db = 0.0;
                      in_XMM4_Dc = 0.0;
                      in_XMM4_Dd = 0.0;
                      if (psVar19[1].type == '\x02') {
                        fVar49 = (float)(int)psVar19->x * local_78 - local_198;
                        in_XMM4_Da = (float)(int)psVar19->y * fVar60 - fStack_194;
                        fVar50 = ABS(fVar49 * fVar40 - fVar56 * in_XMM4_Da) *
                                 *(float *)(local_170 + uVar24 * 4);
                        in_XMM4_Db = 0.0;
                        in_XMM4_Dc = 0.0;
                        in_XMM4_Dd = 0.0;
                        if (fVar50 < fVar61) {
                          fVar56 = -(fVar56 * fVar49 + fVar40 * in_XMM4_Da) /
                                   (fVar49 * fVar49 + in_XMM4_Da * in_XMM4_Da);
                          uVar32 = -(uint)(0.0 <= fVar56);
                          uVar33 = -(uint)(fVar56 <= 1.0);
                          fVar61 = (float)(~uVar32 & (uint)fVar61 |
                                          (~uVar33 & (uint)fVar61 | (uint)fVar50 & uVar33) & uVar32)
                          ;
                          in_XMM4_Da = in_XMM4_Da * in_XMM4_Da;
                        }
                      }
                    }
                    uVar24 = uVar24 + 1;
                    psVar19 = psVar19 + 1;
                  } while (uVar30 != uVar24);
                }
                puVar31 = local_120;
                iVar29 = local_1a0;
                iVar18 = local_19c;
                if (iVar22 == 0) {
                  fVar61 = -fVar61;
                }
              }
              fVar61 = fVar61 * local_1c4 + local_100;
              fVar34 = 0.0;
              if ((0.0 <= fVar61) && (fVar34 = fVar61, 255.0 < fVar61)) {
                fVar34 = 255.0;
              }
              puVar31[(iVar18 - local_1bc) + (local_1d4 - local_1cc) * iVar29] = (uchar)(int)fVar34;
              iVar18 = iVar18 + 1;
              iVar22 = local_1d0;
              iVar17 = local_1c0;
            } while (iVar18 < local_1c0);
          }
          local_1d4 = local_1d4 + 1;
        } while (local_1d4 < iVar22);
      }
      psVar15 = local_90;
      (**(code **)((long)local_90->userdata + 0x10))(*local_90->userdata,local_170);
      (**(code **)((long)psVar15->userdata + 0x10))(*psVar15->userdata,local_38);
      return puVar31;
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBTT_DEF unsigned char * stbtt_GetGlyphSDF(const stbtt_fontinfo *info, float scale, int glyph, int padding, unsigned char onedge_value, float pixel_dist_scale, int *width, int *height, int *xoff, int *yoff)
{
float scale_x = scale, scale_y = scale;
int ix0,iy0,ix1,iy1;
int w,h;
unsigned char *data;

if (scale == 0) return NULL;

stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale, scale, 0.0f,0.0f, &ix0,&iy0,&ix1,&iy1);

/*  if empty, return NULL */
if (ix0 == ix1 || iy0 == iy1)
return NULL;

ix0 -= padding;
iy0 -= padding;
ix1 += padding;
iy1 += padding;

w = (ix1 - ix0);
h = (iy1 - iy0);

if (width ) *width  = w;
if (height) *height = h;
if (xoff  ) *xoff   = ix0;
if (yoff  ) *yoff   = iy0;

/*  invert for y-downwards bitmaps */
scale_y = -scale_y;

{
int x,y,i,j;
float *precompute;
stbtt_vertex *verts;
int num_verts = stbtt_GetGlyphShape(info, glyph, &verts);
data = (unsigned char *) STBTT_malloc(w * h, info->userdata);
precompute = (float *) STBTT_malloc(num_verts * sizeof(float), info->userdata);

for (i=0,j=num_verts-1; i < num_verts; j=i++) {
if (verts[i].type == STBTT_vline) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;
float x1 = verts[j].x*scale_x, y1 = verts[j].y*scale_y;
float dist = (float) STBTT_sqrt((x1-x0)*(x1-x0) + (y1-y0)*(y1-y0));
precompute[i] = (dist == 0) ? 0.0f : 1.0f / dist;
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[j].x *scale_x, y2 = verts[j].y *scale_y;
float x1 = verts[i].cx*scale_x, y1 = verts[i].cy*scale_y;
float x0 = verts[i].x *scale_x, y0 = verts[i].y *scale_y;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float len2 = bx*bx + by*by;
if (len2 != 0.0f)
precompute[i] = 1.0f / (bx*bx + by*by);
else
precompute[i] = 0.0f;
} else
precompute[i] = 0.0f;
}

for (y=iy0; y < iy1; ++y) {
for (x=ix0; x < ix1; ++x) {
float val;
float min_dist = 999999.0f;
float sx = (float) x + 0.5f;
float sy = (float) y + 0.5f;
float x_gspace = (sx / scale_x);
float y_gspace = (sy / scale_y);

int winding = stbtt__compute_crossings_x(x_gspace, y_gspace, num_verts, verts); /*  @OPTIMIZE: this could just be a rasterization, but needs to be line vs. non-tesselated curves so a new path */

for (i=0; i < num_verts; ++i) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;

/*  check against every point here rather than inside line/curve primitives -- @TODO: wrong if multiple 'moves' in a row produce a garbage point, and given culling, probably more efficient to do within line/curve */
float dist2 = (x0-sx)*(x0-sx) + (y0-sy)*(y0-sy);
if (dist2 < min_dist*min_dist)
min_dist = (float) STBTT_sqrt(dist2);

if (verts[i].type == STBTT_vline) {
float x1 = verts[i-1].x*scale_x, y1 = verts[i-1].y*scale_y;

/*  coarse culling against bbox */
/* if (sx > STBTT_min(x0,x1)-min_dist && sx < STBTT_max(x0,x1)+min_dist && */
/*     sy > STBTT_min(y0,y1)-min_dist && sy < STBTT_max(y0,y1)+min_dist) */
float dist = (float) STBTT_fabs((x1-x0)*(y0-sy) - (y1-y0)*(x0-sx)) * precompute[i];
STBTT_assert(i != 0);
if (dist < min_dist) {
/*  check position along line */
/*  x' = x0 + t*(x1-x0), y' = y0 + t*(y1-y0) */
/*  minimize (x'-sx)*(x'-sx)+(y'-sy)*(y'-sy) */
float dx = x1-x0, dy = y1-y0;
float px = x0-sx, py = y0-sy;
/*  minimize (px+t*dx)^2 + (py+t*dy)^2 = px*px + 2*px*dx*t + t^2*dx*dx + py*py + 2*py*dy*t + t^2*dy*dy */
/*  derivative: 2*px*dx + 2*py*dy + (2*dx*dx+2*dy*dy)*t, set to 0 and solve */
float t = -(px*dx + py*dy) / (dx*dx + dy*dy);
if (t >= 0.0f && t <= 1.0f)
min_dist = dist;
}
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[i-1].x *scale_x, y2 = verts[i-1].y *scale_y;
float x1 = verts[i  ].cx*scale_x, y1 = verts[i  ].cy*scale_y;
float box_x0 = STBTT_min(STBTT_min(x0,x1),x2);
float box_y0 = STBTT_min(STBTT_min(y0,y1),y2);
float box_x1 = STBTT_max(STBTT_max(x0,x1),x2);
float box_y1 = STBTT_max(STBTT_max(y0,y1),y2);
/*  coarse culling against bbox to avoid computing cubic unnecessarily */
if (sx > box_x0-min_dist && sx < box_x1+min_dist && sy > box_y0-min_dist && sy < box_y1+min_dist) {
int num=0;
float ax = x1-x0, ay = y1-y0;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float mx = x0 - sx, my = y0 - sy;
float res[3],px,py,t,it;
float a_inv = precompute[i];
if (a_inv == 0.0) { /*  if a_inv is 0, it's 2nd degree so use quadratic formula */
float a = 3*(ax*bx + ay*by);
float b = 2*(ax*ax + ay*ay) + (mx*bx+my*by);
float c = mx*ax+my*ay;
if (a == 0.0) { /*  if a is 0, it's linear */
if (b != 0.0) {
res[num++] = -c/b;
}
} else {
float discriminant = b*b - 4*a*c;
if (discriminant < 0)
num = 0;
else {
float root = (float) STBTT_sqrt(discriminant);
res[0] = (-b - root)/(2*a);
res[1] = (-b + root)/(2*a);
num = 2; /*  don't bother distinguishing 1-solution case, as code below will still work */
}
}
} else {
float b = 3*(ax*bx + ay*by) * a_inv; /*  could precompute this as it doesn't depend on sample point */
float c = (2*(ax*ax + ay*ay) + (mx*bx+my*by)) * a_inv;
float d = (mx*ax+my*ay) * a_inv;
num = stbtt__solve_cubic(b, c, d, res);
}
if (num >= 1 && res[0] >= 0.0f && res[0] <= 1.0f) {
t = res[0], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 2 && res[1] >= 0.0f && res[1] <= 1.0f) {
t = res[1], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 3 && res[2] >= 0.0f && res[2] <= 1.0f) {
t = res[2], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
}
}
}
if (winding == 0)
min_dist = -min_dist;  /*  if outside the shape, value is negative */
val = onedge_value + pixel_dist_scale * min_dist;
if (val < 0)
val = 0;
else if (val > 255)
val = 255;
data[(y-iy0)*w+(x-ix0)] = (unsigned char) val;
}
}
STBTT_free(precompute, info->userdata);
STBTT_free(verts, info->userdata);
}
return data;
}